

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

CavsByBdryStatus *
Omega_h::separate_cavities
          (CavsByBdryStatus *__return_storage_ptr__,Mesh *old_mesh,Mesh *new_mesh,Cavs *cavs,
          Int key_dim,LOs *keys2kds,Graph *keys2doms)

{
  Int IVar1;
  Cavs local_4e0;
  LOs new_elem_class_ids;
  LOs old_elem_class_ids;
  LOs bdry_cavs2cavs;
  Bytes keys_are_bdry;
  Read<signed_char> key_class_dims;
  Bytes cavs_are_bdry;
  Read<int> old_elems_are_bdry;
  Write<int> local_430;
  Write<int> local_420;
  Write<int> local_410;
  Write<int> local_400;
  Write<signed_char> local_3f0;
  Read<int> new_bdry_colors;
  Read<signed_char> new_elems_are_bdry;
  Read<int> old_bdry_colors;
  Write<int> local_3b0;
  Write<int> local_3a0;
  Write<int> local_390;
  Write<signed_char> local_380;
  LOs touch_cavs2cavs;
  Write<signed_char> local_360;
  Write<signed_char> local_350;
  Bytes cavs_touch_bdry;
  Write<signed_char> local_330;
  Read<signed_char> keys_arent_bdry;
  Write<int> local_310;
  Write<int> local_300;
  Write<signed_char> local_2f0;
  Write<signed_char> local_2e0;
  Write<signed_char> local_2d0;
  Write<int> local_2c0;
  Write<signed_char> local_2b0;
  Read<signed_char> kd_class_dims;
  Write<int> local_290;
  Write<signed_char> local_280;
  LOs int_cavs2cavs;
  Write<signed_char> local_260;
  Read<signed_char> cavs_arent_bdry;
  Write<int> local_240;
  Write<int> local_230;
  Read<int> cavs2nbdry_elems;
  Write<signed_char> local_210;
  Read<signed_char> old_elems_are_bdry_i8;
  Graph local_1f0;
  Graph local_1d0;
  Cavs local_1b0;
  Cavs local_170;
  Cavs local_130;
  Cavs local_f0;
  Cavs local_b0;
  Cavs local_70;
  
  memset(__return_storage_ptr__,0,0xd8);
  get_elems_are_bdry((Omega_h *)&old_elems_are_bdry_i8,old_mesh);
  Write<signed_char>::Write(&local_210,&old_elems_are_bdry_i8.write_);
  array_cast<int,signed_char>((Omega_h *)&old_elems_are_bdry,(Read<signed_char> *)&local_210);
  Write<signed_char>::~Write(&local_210);
  Graph::Graph(&local_1d0,&cavs->keys2old_elems);
  Write<int>::Write(&local_230,&old_elems_are_bdry.write_);
  graph_reduce<int>((Omega_h *)&cavs2nbdry_elems,&local_1d0,(Read<int> *)&local_230,1,OMEGA_H_SUM);
  Write<int>::~Write(&local_230);
  Graph::~Graph(&local_1d0);
  Write<int>::Write(&local_240,&cavs2nbdry_elems.write_);
  each_gt<int>((Omega_h *)&cavs_are_bdry,(Read<int> *)&local_240,0);
  Write<int>::~Write(&local_240);
  Write<signed_char>::Write(&local_260,&cavs_are_bdry.write_);
  invert_marks((Omega_h *)&cavs_arent_bdry,(Read<signed_char> *)&local_260);
  Write<signed_char>::~Write(&local_260);
  Write<signed_char>::Write(&local_280,&cavs_arent_bdry.write_);
  collect_marked((Omega_h *)&int_cavs2cavs,(Read<signed_char> *)&local_280);
  Write<signed_char>::~Write(&local_280);
  Write<int>::Write(&local_290,&int_cavs2cavs.write_);
  Cavs::Cavs(&local_70,cavs);
  unmap_cavs(&local_4e0,(LOs *)&local_290,&local_70);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::emplace_back<Omega_h::Cavs>
            ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)__return_storage_ptr__,
             &local_4e0);
  Cavs::~Cavs(&local_4e0);
  Cavs::~Cavs(&local_70);
  Write<int>::~Write(&local_290);
  std::__cxx11::string::string((string *)&local_4e0,"class_dim",(allocator *)&key_class_dims);
  Mesh::get_array<signed_char>((Mesh *)&kd_class_dims,(Int)old_mesh,(string *)(ulong)(uint)key_dim);
  std::__cxx11::string::~string((string *)&local_4e0);
  Write<int>::Write(&local_2c0,&keys2kds->write_);
  Write<signed_char>::Write(&local_2d0,&kd_class_dims.write_);
  unmap<signed_char>((Omega_h *)&local_2b0,(LOs *)&local_2c0,(Read<signed_char> *)&local_2d0,1);
  read<signed_char>((Omega_h *)&key_class_dims,&local_2b0);
  Write<signed_char>::~Write(&local_2b0);
  Write<signed_char>::~Write(&local_2d0);
  Write<int>::~Write(&local_2c0);
  Write<signed_char>::Write(&local_2e0,&key_class_dims.write_);
  IVar1 = Mesh::dim(old_mesh);
  each_lt<signed_char>((Omega_h *)&keys_are_bdry,(Read<signed_char> *)&local_2e0,(char)IVar1);
  Write<signed_char>::~Write(&local_2e0);
  Write<signed_char>::Write(&local_2f0,&keys_are_bdry.write_);
  collect_marked((Omega_h *)&bdry_cavs2cavs,(Read<signed_char> *)&local_2f0);
  Write<signed_char>::~Write(&local_2f0);
  Write<int>::Write(&local_300,&bdry_cavs2cavs.write_);
  Cavs::Cavs(&local_b0,cavs);
  unmap_cavs(&local_4e0,(LOs *)&local_300,&local_b0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::emplace_back<Omega_h::Cavs>
            (__return_storage_ptr__->_M_elems[2]._M_elems,&local_4e0);
  Cavs::~Cavs(&local_4e0);
  Cavs::~Cavs(&local_b0);
  Write<int>::~Write(&local_300);
  if (keys2doms != (Graph *)0x0) {
    Write<int>::Write(&local_310,&bdry_cavs2cavs.write_);
    Graph::Graph(&local_1f0,keys2doms);
    unmap_graph(&local_4e0.keys2old_elems,(LOs *)&local_310,&local_1f0);
    Graph::operator=(keys2doms,&local_4e0.keys2old_elems);
    Graph::~Graph(&local_4e0.keys2old_elems);
    Graph::~Graph(&local_1f0);
    Write<int>::~Write(&local_310);
  }
  Write<signed_char>::Write(&local_330,&keys_are_bdry.write_);
  invert_marks((Omega_h *)&keys_arent_bdry,(Read<signed_char> *)&local_330);
  Write<signed_char>::~Write(&local_330);
  Write<signed_char>::Write(&local_350,&cavs_are_bdry.write_);
  Write<signed_char>::Write(&local_360,&keys_arent_bdry.write_);
  land_each((Omega_h *)&cavs_touch_bdry,(Bytes *)&local_350,(Bytes *)&local_360);
  Write<signed_char>::~Write(&local_360);
  Write<signed_char>::~Write(&local_350);
  Write<signed_char>::Write(&local_380,&cavs_touch_bdry.write_);
  collect_marked((Omega_h *)&touch_cavs2cavs,(Read<signed_char> *)&local_380);
  Write<signed_char>::~Write(&local_380);
  Write<int>::Write(&local_390,&touch_cavs2cavs.write_);
  Cavs::Cavs(&local_f0,cavs);
  unmap_cavs(&local_4e0,(LOs *)&local_390,&local_f0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::emplace_back<Omega_h::Cavs>
            (__return_storage_ptr__->_M_elems[1]._M_elems,&local_4e0);
  Cavs::~Cavs(&local_4e0);
  Cavs::~Cavs(&local_f0);
  Write<int>::~Write(&local_390);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
            (__return_storage_ptr__->_M_elems[0]._M_elems + 1,
             __return_storage_ptr__->_M_elems[0]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
            (__return_storage_ptr__->_M_elems[1]._M_elems + 1,
             __return_storage_ptr__->_M_elems[1]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start);
  get_elem_class_ids((Omega_h *)&old_elem_class_ids,old_mesh);
  get_elem_class_ids((Omega_h *)&new_elem_class_ids,new_mesh);
  Cavs::Cavs(&local_130,
             __return_storage_ptr__->_M_elems[2]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start);
  Write<int>::Write(&local_3a0,&old_elem_class_ids.write_);
  Write<int>::Write(&local_3b0,&new_elem_class_ids.write_);
  separate_by_color((CavsByColor *)&local_4e0,&local_130,(LOs *)&local_3a0,(LOs *)&local_3b0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::_M_move_assign
            (__return_storage_ptr__->_M_elems[2]._M_elems + 1,&local_4e0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
            ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)&local_4e0);
  Write<int>::~Write(&local_3b0);
  Write<int>::~Write(&local_3a0);
  Cavs::~Cavs(&local_130);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
            (__return_storage_ptr__->_M_elems[0]._M_elems + 2,
             __return_storage_ptr__->_M_elems[0]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start);
  Write<int>::Write(&old_bdry_colors.write_,&old_elems_are_bdry.write_);
  get_elems_are_bdry((Omega_h *)&new_elems_are_bdry,new_mesh);
  Write<signed_char>::Write(&local_3f0,&new_elems_are_bdry.write_);
  array_cast<int,signed_char>((Omega_h *)&new_bdry_colors,(Read<signed_char> *)&local_3f0);
  Write<signed_char>::~Write(&local_3f0);
  Cavs::Cavs(&local_170,
             __return_storage_ptr__->_M_elems[1]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start);
  Write<int>::Write(&local_400,&old_bdry_colors.write_);
  Write<int>::Write(&local_410,&new_bdry_colors.write_);
  separate_by_color((CavsByColor *)&local_4e0,&local_170,(LOs *)&local_400,(LOs *)&local_410);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::_M_move_assign
            (__return_storage_ptr__->_M_elems[1]._M_elems + 2,&local_4e0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
            ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)&local_4e0);
  Write<int>::~Write(&local_410);
  Write<int>::~Write(&local_400);
  Cavs::~Cavs(&local_170);
  Cavs::Cavs(&local_1b0,
             __return_storage_ptr__->_M_elems[2]._M_elems[0].
             super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
             super__Vector_impl_data._M_start);
  Write<int>::Write(&local_420,&old_elem_class_ids.write_);
  Write<int>::Write(&local_430,&new_elem_class_ids.write_);
  separate_by_color((CavsByColor *)&local_4e0,&local_1b0,(LOs *)&local_420,(LOs *)&local_430);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::_M_move_assign
            (__return_storage_ptr__->_M_elems[2]._M_elems + 2,&local_4e0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
            ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)&local_4e0);
  Write<int>::~Write(&local_430);
  Write<int>::~Write(&local_420);
  Cavs::~Cavs(&local_1b0);
  Write<int>::~Write(&new_bdry_colors.write_);
  Write<signed_char>::~Write(&new_elems_are_bdry.write_);
  Write<int>::~Write(&old_bdry_colors.write_);
  Write<int>::~Write(&new_elem_class_ids.write_);
  Write<int>::~Write(&old_elem_class_ids.write_);
  Write<int>::~Write(&touch_cavs2cavs.write_);
  Write<signed_char>::~Write(&cavs_touch_bdry.write_);
  Write<signed_char>::~Write(&keys_arent_bdry.write_);
  Write<int>::~Write(&bdry_cavs2cavs.write_);
  Write<signed_char>::~Write(&keys_are_bdry.write_);
  Write<signed_char>::~Write(&key_class_dims.write_);
  Write<signed_char>::~Write(&kd_class_dims.write_);
  Write<int>::~Write(&int_cavs2cavs.write_);
  Write<signed_char>::~Write(&cavs_arent_bdry.write_);
  Write<signed_char>::~Write(&cavs_are_bdry.write_);
  Write<int>::~Write(&cavs2nbdry_elems.write_);
  Write<int>::~Write(&old_elems_are_bdry.write_);
  Write<signed_char>::~Write(&old_elems_are_bdry_i8.write_);
  return __return_storage_ptr__;
}

Assistant:

static CavsByBdryStatus separate_cavities(Mesh* old_mesh, Mesh* new_mesh,
    Cavs cavs, Int key_dim, LOs keys2kds, Graph* keys2doms = nullptr) {
  CavsByBdryStatus out;
  auto old_elems_are_bdry_i8 = get_elems_are_bdry(old_mesh);
  auto old_elems_are_bdry = array_cast<LO>(old_elems_are_bdry_i8);
  auto cavs2nbdry_elems =
      graph_reduce(cavs.keys2old_elems, old_elems_are_bdry, 1, OMEGA_H_SUM);
  auto cavs_are_bdry = each_gt(cavs2nbdry_elems, 0);
  auto cavs_arent_bdry = invert_marks(cavs_are_bdry);
  auto int_cavs2cavs = collect_marked(cavs_arent_bdry);
  out[NOT_BDRY][NO_COLOR].push_back(unmap_cavs(int_cavs2cavs, cavs));
  auto kd_class_dims = old_mesh->get_array<I8>(key_dim, "class_dim");
  auto key_class_dims = read(unmap(keys2kds, kd_class_dims, 1));
  auto keys_are_bdry = each_lt(key_class_dims, I8(old_mesh->dim()));
  auto bdry_cavs2cavs = collect_marked(keys_are_bdry);
  out[KEY_BDRY][NO_COLOR].push_back(unmap_cavs(bdry_cavs2cavs, cavs));
  if (keys2doms) *keys2doms = unmap_graph(bdry_cavs2cavs, *keys2doms);
  auto keys_arent_bdry = invert_marks(keys_are_bdry);
  auto cavs_touch_bdry = land_each(cavs_are_bdry, keys_arent_bdry);
  auto touch_cavs2cavs = collect_marked(cavs_touch_bdry);
  out[TOUCH_BDRY][NO_COLOR].push_back(unmap_cavs(touch_cavs2cavs, cavs));
  out[NOT_BDRY][CLASS_COLOR].push_back(out[NOT_BDRY][NO_COLOR][0]);
  out[TOUCH_BDRY][CLASS_COLOR].push_back(out[TOUCH_BDRY][NO_COLOR][0]);
  auto old_elem_class_ids = get_elem_class_ids(old_mesh);
  auto new_elem_class_ids = get_elem_class_ids(new_mesh);
  out[KEY_BDRY][CLASS_COLOR] = separate_by_color(
      out[KEY_BDRY][NO_COLOR][0], old_elem_class_ids, new_elem_class_ids);
  out[NOT_BDRY][CLASS_BDRY_COLOR].push_back(out[NOT_BDRY][NO_COLOR][0]);
  auto old_bdry_colors = old_elems_are_bdry;
  auto new_elems_are_bdry = get_elems_are_bdry(new_mesh);
  auto new_bdry_colors = array_cast<LO>(new_elems_are_bdry);
  out[TOUCH_BDRY][CLASS_BDRY_COLOR] = separate_by_color(
      out[TOUCH_BDRY][NO_COLOR][0], old_bdry_colors, new_bdry_colors);
  out[KEY_BDRY][CLASS_BDRY_COLOR] = separate_by_color(
      out[KEY_BDRY][NO_COLOR][0], old_elem_class_ids, new_elem_class_ids);
  return out;
}